

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::SSLClient::read_and_close_socket(SSLClient *this,socket_t sock,Request *req,Response *res)

{
  anon_class_24_3_c00b9e15 callback;
  bool bVar1;
  int iVar2;
  
  iVar2 = (*(this->super_Client)._vptr_Client[2])();
  if ((char)iVar2 == '\0') {
    bVar1 = false;
  }
  else {
    callback.req = req;
    callback.this = this;
    callback.res = res;
    bVar1 = detail::
            read_and_close_socket_ssl<int(*)(ssl_st*),httplib::SSLClient::read_and_close_socket(int,httplib::Request&,httplib::Response&)::_lambda(ssl_st*)_1_,httplib::SSLClient::read_and_close_socket(int,httplib::Request&,httplib::Response&)::_lambda(httplib::Stream&,bool,bool&)_1_>
                      (sock,0,this->ctx_,&this->ctx_mutex_,SSL_connect,(anon_class_8_1_8991fb9c)this
                       ,callback);
  }
  return bVar1;
}

Assistant:

inline bool SSLClient::read_and_close_socket(socket_t sock, Request& req, Response& res)
{
    return is_valid() && detail::read_and_close_socket_ssl(
        sock, 0,
        ctx_, ctx_mutex_,
        SSL_connect,
        [&](SSL* ssl) {
            SSL_set_tlsext_host_name(ssl, host_.c_str());
        },
        [&](Stream& strm, bool /*last_connection*/, bool& connection_close) {
            return process_request(strm, req, res, connection_close);
        });
}